

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O2

int uv_udp_connect(uv_udp_t *handle,sockaddr *addr)

{
  byte *pbVar1;
  int iVar2;
  int *piVar3;
  sockaddr sStack_38;
  undefined8 uStack_28;
  socklen_t __len;
  
  iVar2 = -0x16;
  if (handle->type == UV_UDP) {
    if (addr == (sockaddr *)0x0) {
      if ((handle->flags & 0x2000000) == 0) {
        return -0x6b;
      }
      piVar3 = __errno_location();
      sStack_38.sa_family = 0;
      sStack_38.sa_data[0] = '\0';
      sStack_38.sa_data[1] = '\0';
      sStack_38.sa_data[2] = '\0';
      sStack_38.sa_data[3] = '\0';
      sStack_38.sa_data[4] = '\0';
      sStack_38.sa_data[5] = '\0';
      sStack_38.sa_data[6] = '\0';
      sStack_38.sa_data[7] = '\0';
      sStack_38.sa_data[8] = '\0';
      sStack_38.sa_data[9] = '\0';
      sStack_38.sa_data[10] = '\0';
      sStack_38.sa_data[0xb] = '\0';
      sStack_38.sa_data[0xc] = '\0';
      sStack_38.sa_data[0xd] = '\0';
      do {
        *piVar3 = 0;
        iVar2 = connect((handle->io_watcher).fd,&sStack_38,0x10);
        if (iVar2 != -1) goto LAB_001177e6;
        iVar2 = *piVar3;
      } while (iVar2 == 4);
      if (iVar2 == 0x61) {
LAB_001177e6:
        pbVar1 = (byte *)((long)&handle->flags + 3);
        *pbVar1 = *pbVar1 & 0xfd;
        iVar2 = 0;
      }
      else {
        iVar2 = -iVar2;
      }
      return iVar2;
    }
    if (addr->sa_family == 2) {
      __len = 0x10;
    }
    else {
      if (addr->sa_family != 10) {
        return -0x16;
      }
      __len = 0x1c;
    }
    if ((handle->flags & 0x2000000) == 0) {
      uStack_28 = 0xffffffffffffffea;
      sStack_38.sa_data[6] = -0x29;
      sStack_38.sa_data[7] = 'v';
      sStack_38.sa_data[8] = '\x11';
      sStack_38.sa_data[9] = '\0';
      sStack_38.sa_data[10] = '\0';
      sStack_38.sa_data[0xb] = '\0';
      sStack_38.sa_data[0xc] = '\0';
      sStack_38.sa_data[0xd] = '\0';
      iVar2 = uv__udp_maybe_deferred_bind(handle,(uint)addr->sa_family,0);
      if (iVar2 == 0) {
        sStack_38.sa_data[6] = -0x20;
        sStack_38.sa_data[7] = 'v';
        sStack_38.sa_data[8] = '\x11';
        sStack_38.sa_data[9] = '\0';
        sStack_38.sa_data[10] = '\0';
        sStack_38.sa_data[0xb] = '\0';
        sStack_38.sa_data[0xc] = '\0';
        sStack_38.sa_data[0xd] = '\0';
        piVar3 = __errno_location();
        do {
          *piVar3 = 0;
          sStack_38.sa_data[6] = -9;
          sStack_38.sa_data[7] = 'v';
          sStack_38.sa_data[8] = '\x11';
          sStack_38.sa_data[9] = '\0';
          sStack_38.sa_data[10] = '\0';
          sStack_38.sa_data[0xb] = '\0';
          sStack_38.sa_data[0xc] = '\0';
          sStack_38.sa_data[0xd] = '\0';
          iVar2 = connect((handle->io_watcher).fd,(sockaddr *)addr,__len);
          if (iVar2 != -1) {
            if (iVar2 == 0) {
              pbVar1 = (byte *)((long)&handle->flags + 3);
              *pbVar1 = *pbVar1 | 2;
              return 0;
            }
            iVar2 = *piVar3;
            break;
          }
          iVar2 = *piVar3;
        } while (iVar2 == 4);
        iVar2 = -iVar2;
      }
      return iVar2;
    }
    iVar2 = -0x6a;
  }
  return iVar2;
}

Assistant:

int uv_udp_connect(uv_udp_t* handle, const struct sockaddr* addr) {
  unsigned int addrlen;

  if (handle->type != UV_UDP)
    return UV_EINVAL;

  /* Disconnect the handle */
  if (addr == NULL) {
    if (!(handle->flags & UV_HANDLE_UDP_CONNECTED))
      return UV_ENOTCONN;

    return uv__udp_disconnect(handle);
  }

  if (addr->sa_family == AF_INET)
    addrlen = sizeof(struct sockaddr_in);
  else if (addr->sa_family == AF_INET6)
    addrlen = sizeof(struct sockaddr_in6);
  else
    return UV_EINVAL;

  if (handle->flags & UV_HANDLE_UDP_CONNECTED)
    return UV_EISCONN;

  return uv__udp_connect(handle, addr, addrlen);
}